

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffmrhd(fitsfile *fptr,int hdumov,int *exttype,int *status)

{
  int *in_RCX;
  int extnum;
  int *in_stack_00000030;
  int *in_stack_00000038;
  int in_stack_00000044;
  fitsfile *in_stack_00000048;
  undefined4 local_4;
  
  if (*in_RCX < 1) {
    ffmahd(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000030);
    local_4 = *in_RCX;
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int ffmrhd(fitsfile *fptr,      /* I - FITS file pointer                    */
           int hdumov,          /* I - rel. no. of HDUs to move by (+ or -) */ 
           int *exttype,        /* O - type of extension, 0, 1, or 2        */
           int *status)         /* IO - error status                        */
/*
  Move a Relative number of Header Data units.  Offset to the specified
  extension and read the header to initialize the HDU structure. 
*/
{
    int extnum;

    if (*status > 0)
        return(*status);

    extnum = fptr->HDUposition + 1 + hdumov;  /* the absolute HDU number */
    ffmahd(fptr, extnum, exttype, status);  /* move to the HDU */

    return(*status);
}